

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QList<QBenchmarkResult>_>::reallocateAndGrow
          (QArrayDataPointer<QList<QBenchmarkResult>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QList<QBenchmarkResult>_> *old)

{
  Data *pDVar1;
  QBenchmarkResult *pQVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QList<QBenchmarkResult> *pQVar5;
  undefined1 *puVar6;
  bool bVar7;
  QList<QBenchmarkResult> *pQVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QList<QBenchmarkResult>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0 && where == GrowsAtEnd) {
    pDVar4 = this->d;
    if (pDVar4 == (Data *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = 1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar7)) {
      if (pDVar4 == (Data *)0x0) {
        lVar10 = 0;
        lVar9 = 0;
      }
      else {
        lVar10 = (pDVar4->super_QArrayData).alloc;
        lVar9 = (this->size - (pDVar4->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3) * -0x5555555555555555;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>_>::reallocate
                  ((QMovableArrayOps<QList<QBenchmarkResult>_> *)this,lVar10 + n + lVar9,Grow);
        return;
      }
      goto LAB_0013700c;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QList<QBenchmarkResult> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (QList<QBenchmarkResult> *)0x0)) {
    if (this->size != 0) {
      lVar10 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pQVar8 = this->ptr;
      pQVar5 = pQVar8 + lVar10;
      if ((old != (QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0) || (bVar7)) {
        if ((lVar10 != 0) && (0 < lVar10)) {
          do {
            pDVar1 = (pQVar8->d).d;
            local_38.ptr[local_38.size].d.d = pDVar1;
            local_38.ptr[local_38.size].d.ptr = (pQVar8->d).ptr;
            local_38.ptr[local_38.size].d.size = (pQVar8->d).size;
            if (pDVar1 != (Data *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar8 = pQVar8 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar8 < pQVar5);
        }
      }
      else if ((lVar10 != 0) && (0 < lVar10)) {
        do {
          pDVar1 = (pQVar8->d).d;
          (pQVar8->d).d = (Data *)0x0;
          local_38.ptr[local_38.size].d.d = pDVar1;
          pQVar2 = (pQVar8->d).ptr;
          (pQVar8->d).ptr = (QBenchmarkResult *)0x0;
          local_38.ptr[local_38.size].d.ptr = pQVar2;
          qVar3 = (pQVar8->d).size;
          (pQVar8->d).size = 0;
          local_38.ptr[local_38.size].d.size = qVar3;
          pQVar8 = pQVar8 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar8 < pQVar5);
      }
    }
    pDVar4 = this->d;
    pQVar5 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar6 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pQVar5;
    local_38.size = (qsizetype)puVar6;
    if (old != (QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pQVar5;
      local_38.size = old->size;
      old->size = (qsizetype)puVar6;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_0013700c:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }